

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O0

void __thiscall helix::order_book::add(order_book *this,order order)

{
  invalid_argument *this_00;
  hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_RDI;
  side_type in_stack_00000028;
  price_level *level_1;
  price_level *level;
  order *__lhs;
  order *args;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  map<unsigned_long,_helix::price_level,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  *in_stack_ffffffffffffff98;
  order_book *in_stack_ffffffffffffffa0;
  string local_58 [32];
  string local_38 [32];
  price_level *local_18;
  price_level *local_10;
  
  __lhs = (order *)&stack0x00000008;
  if (in_stack_00000028 == buy) {
    local_10 = lookup_or_create<std::map<unsigned_long,helix::price_level,std::greater<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    args = __lhs;
    __lhs->level = local_10;
    local_10->size = __lhs->quantity + local_10->size;
  }
  else {
    if (in_stack_00000028 != sell) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"invalid side: ",(allocator *)&stack0xffffffffffffffa7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char)((ulong)&stack0xffffffffffffffa7 >> 0x38));
      std::invalid_argument::invalid_argument(this_00,local_38);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_18 = lookup_or_create<std::map<unsigned_long,helix::price_level,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,helix::price_level>>>>
                         (in_stack_ffffffffffffffa0,
                          (map<unsigned_long,_helix::price_level,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
                           *)in_stack_ffffffffffffff98,
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    args = __lhs;
    __lhs->level = local_18;
    local_18->size = __lhs->quantity + local_18->size;
  }
  boost::multi_index::detail::
  hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  ::emplace<helix::order>(in_RDI,args);
  return;
}

Assistant:

void order_book::add(order order)
{
    switch (order.side) {
    case side_type::buy: {
        auto&& level = lookup_or_create(_bids, order.price);
        order.level = &level;
        level.size += order.quantity;
        break;
    }
    case side_type::sell: {
        auto&& level = lookup_or_create(_asks, order.price);
        order.level = &level;
        level.size += order.quantity;
        break;
    }
    default:
        throw std::invalid_argument(std::string("invalid side: ") + static_cast<char>(order.side));
    }
    _orders.emplace(std::move(order));
}